

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

bool kratos::is_valid_verilog
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *src)

{
  bool bVar1;
  _Base_ptr p_Var2;
  undefined1 local_48 [8];
  string final_src;
  
  local_48 = (undefined1  [8])&final_src._M_string_length;
  final_src._M_dataplus._M_p = (pointer)0x0;
  final_src._M_string_length._0_1_ = 0;
  for (p_Var2 = (src->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(src->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::append((string *)local_48);
    std::__cxx11::string::append((char *)local_48);
  }
  bVar1 = is_valid_verilog((string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return bVar1;
}

Assistant:

bool is_valid_verilog(const std::map<std::string, std::string> &src) {
    std::string final_src;
    for (auto const &iter : src) {
        final_src.append(iter.second);
        final_src.append("\n");
    }
    return is_valid_verilog(final_src);
}